

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

Vec_Ptr_t * Gia_IsoCollectCosClasses(Gia_IsoMan_t *p,int fVerbose)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  size_t sVar13;
  size_t __nmemb;
  long lVar14;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pGVar4 = p->pGia;
  pVVar5 = pGVar4->vCos;
  uVar8 = (ulong)(uint)pVVar5->nSize;
  if (pGVar4->nRegs < pVVar5->nSize) {
    lVar14 = 0;
    do {
      if ((int)uVar8 <= lVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = pVVar5->pArray[lVar14];
      if (((long)iVar9 < 0) || (pGVar4->nObjs <= iVar9)) {
LAB_00747090:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4->pObjs == (Gia_Obj_t *)0x0) break;
      if (0 < p->pUniques[iVar9]) {
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        pVVar5->nCap = 0x10;
        pVVar5->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        pVVar5->pArray = piVar6;
        Vec_IntPush(pVVar5,(int)lVar14);
        uVar7 = pVVar2->nSize;
        uVar11 = pVVar2->nCap;
        if (uVar7 == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar11 * 2;
            if (iVar9 <= (int)uVar11) goto LAB_00746e18;
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar11 << 4);
            }
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar9;
        }
LAB_00746e18:
        pVVar2->nSize = uVar7 + 1;
        pVVar2->pArray[(int)uVar7] = pVVar5;
      }
      lVar14 = lVar14 + 1;
      pGVar4 = p->pGia;
      pVVar5 = pGVar4->vCos;
      uVar8 = (ulong)pVVar5->nSize;
    } while (lVar14 < (long)(uVar8 - (long)pGVar4->nRegs));
  }
  pVVar5 = p->vClasses;
  if (1 < pVVar5->nSize) {
    lVar14 = 0;
    do {
      lVar12 = (long)pVVar5->pArray[lVar14];
      uVar7 = pVVar5->pArray[lVar14 + 1];
      uVar10 = (ulong)uVar7;
      uVar8 = 0;
      if (0 < (int)uVar7) {
        pGVar4 = p->pGia;
        uVar8 = 0;
        do {
          uVar1 = p->pStoreW[lVar12 + uVar8];
          if (((long)uVar1 < 0) || (pGVar4->nObjs <= (int)(uVar1 >> 0x20))) goto LAB_00747090;
          uVar11 = (uint)*(undefined8 *)(pGVar4->pObjs + (uVar1 >> 0x20));
          if (((~uVar11 & 0x1fffffff) != 0 && (int)uVar11 < 0) &&
             ((int)((uint)((ulong)*(undefined8 *)(pGVar4->pObjs + (uVar1 >> 0x20)) >> 0x20) &
                   0x1fffffff) < pGVar4->vCos->nSize - pGVar4->nRegs)) goto LAB_00746ef0;
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
        uVar8 = (ulong)uVar7;
      }
LAB_00746ef0:
      if ((uint)uVar8 != uVar7) {
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        pVVar5->nCap = 0x10;
        pVVar5->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        pVVar5->pArray = piVar6;
        if (0 < (int)uVar7) {
          do {
            uVar8 = p->pStoreW[lVar12];
            if ((long)uVar8 < 0) goto LAB_00747090;
            pGVar4 = p->pGia;
            if (pGVar4->nObjs <= (int)(uVar8 >> 0x20)) goto LAB_00747090;
            uVar7 = (uint)*(undefined8 *)(pGVar4->pObjs + (uVar8 >> 0x20));
            if (((~uVar7 & 0x1fffffff) != 0 && (int)uVar7 < 0) &&
               (uVar11 = (uint)((ulong)*(undefined8 *)(pGVar4->pObjs + (uVar8 >> 0x20)) >> 0x20),
               (int)(uVar11 & 0x1fffffff) < pGVar4->vCos->nSize - pGVar4->nRegs)) {
              if (-1 < (int)uVar7) {
                __assert_fail("pObj->fTerm",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
              }
              Vec_IntPush(pVVar5,uVar11 & 0x1fffffff);
            }
            lVar12 = lVar12 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        uVar7 = pVVar2->nSize;
        uVar11 = pVVar2->nCap;
        if (uVar7 == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar11 * 2;
            if (iVar9 <= (int)uVar11) goto LAB_00746ffc;
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar11 << 4);
            }
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar9;
        }
LAB_00746ffc:
        pVVar2->nSize = uVar7 + 1;
        pVVar2->pArray[(int)uVar7] = pVVar5;
      }
      lVar14 = lVar14 + 2;
      pVVar5 = p->vClasses;
    } while ((int)((uint)lVar14 | 1) < pVVar5->nSize);
  }
  __nmemb = (size_t)pVVar2->nSize;
  if (0 < (long)__nmemb) {
    ppvVar3 = pVVar2->pArray;
    sVar13 = 0;
    do {
      qsort(*(void **)((long)ppvVar3[sVar13] + 8),(long)*(int *)((long)ppvVar3[sVar13] + 4),4,
            Vec_IntSortCompare1);
      sVar13 = sVar13 + 1;
    } while (__nmemb != sVar13);
  }
  qsort(pVVar2->pArray,__nmemb,8,Vec_VecSortCompare3);
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Gia_IsoCollectCosClasses( Gia_IsoMan_t * p, int fVerbose )
{
    Vec_Ptr_t * vGroups;
    Vec_Int_t * vLevel;
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize;
    // add singletons
    vGroups = Vec_PtrAlloc( 1000 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        if ( p->pUniques[Gia_ObjId(p->pGia, pObj)] > 0 )
        {
            vLevel = Vec_IntAlloc( 1 );
            Vec_IntPush( vLevel, i );
            Vec_PtrPush( vGroups, vLevel );
        }

    // add groups
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                break;
        }
        if ( k == nSize )
            continue;
        vLevel = Vec_IntAlloc( 8 );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                Vec_IntPush( vLevel, Gia_ObjCioId(pObj) );
        }
        Vec_PtrPush( vGroups, vLevel );
    }
    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vGroups, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vGroups, 0 );
//    Vec_VecFree( (Vec_Vec_t *)vGroups );
//    return NULL;
    return vGroups;
}